

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O0

rfc5444_writer_message *
rfc5444_writer_register_message(rfc5444_writer *writer,uint8_t msgid,_Bool if_specific)

{
  rfc5444_writer_message *msg;
  _Bool if_specific_local;
  uint8_t msgid_local;
  rfc5444_writer *writer_local;
  
  if (writer->_state == RFC5444_WRITER_NONE) {
    writer_local = (rfc5444_writer *)_get_message(writer,msgid);
    if (writer_local == (rfc5444_writer *)0x0) {
      writer_local = (rfc5444_writer *)0x0;
    }
    else if (((ulong)(writer_local->_msgcreators).list_head.prev & 1) == 0) {
      *(undefined1 *)&(writer_local->_msgcreators).list_head.prev = 1;
      *(_Bool *)((long)&(writer_local->_msgcreators).list_head.prev + 1) = if_specific;
    }
    else {
      writer_local = (rfc5444_writer *)0x0;
    }
    return (rfc5444_writer_message *)writer_local;
  }
  __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                ,0x192,
                "struct rfc5444_writer_message *rfc5444_writer_register_message(struct rfc5444_writer *, uint8_t, _Bool)"
               );
}

Assistant:

struct rfc5444_writer_message *
rfc5444_writer_register_message(struct rfc5444_writer *writer, uint8_t msgid, bool if_specific) {
  struct rfc5444_writer_message *msg;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  msg = _get_message(writer, msgid);
  if (msg == NULL) {
    /* out of memory error */
    return NULL;
  }

  if (msg->_registered) {
    /* message was already _registered */
    return NULL;
  }

  /* mark message as _registered */
  msg->_registered = true;

  /* set target_specific flag */
  msg->target_specific = if_specific;
  return msg;
}